

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

bool DivisionCornerCaseHelper2<signed_char,_int,_safeint_exception_handlers::SafeInt_InvalidParameter,_1>
     ::DivisionCornerCase2
               (int lhs,SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter>
                        rhs,
               SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *result)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *in_RDX;
  undefined1 in_SIL;
  int in_EDI;
  char tmp;
  SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *unaff_retaddr;
  char local_11;
  int iVar4;
  undefined2 in_stack_fffffffffffffffc;
  undefined1 in_stack_ffffffffffffffff;
  
  iVar4 = in_EDI;
  iVar3 = std::numeric_limits<int>::min();
  if ((in_EDI == iVar3) && (cVar1 = ::SafeInt::operator_cast_to_signed_char(in_RDX), cVar1 == -1)) {
    local_11 = '\0';
    bVar2 = div_negate_min<signed_char,_int,_false>::Value(&local_11);
    if (bVar2) {
      SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
                (unaff_retaddr,
                 (char *)CONCAT17(in_stack_ffffffffffffffff,
                                  CONCAT16(in_SIL,CONCAT24(in_stack_fffffffffffffffc,iVar4))));
      return true;
    }
    safeint_exception_handlers::SafeInt_InvalidParameter::SafeIntOnOverflow();
  }
  return false;
}

Assistant:

static bool DivisionCornerCase2( U lhs, SafeInt< T, E > rhs, SafeInt<T, E>& result ) SAFEINT_CPP_THROW
    {
        if( lhs == std::numeric_limits< U >::min() && (T)rhs == -1 )
        {
            // corner case of a corner case - lhs = min int, rhs = -1,
            // but rhs is the return type, so in essence, we can return -lhs
            // if rhs is a larger type than lhs
            // If types are wrong, throws
            T tmp = 0;

            if (div_negate_min< T, U, sizeof(U) < sizeof(T) > ::Value(tmp))
                result = tmp;
            else
                E::SafeIntOnOverflow();

            return true;
        }

        return false;
    }